

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

StringRef __thiscall
Catch::anon_unknown_23::extractFilenamePart(anon_unknown_23 *this,StringRef filename)

{
  char *pcVar1;
  anon_unknown_23 *paVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  StringRef SVar6;
  
  pcVar4 = filename.m_start;
  pcVar5 = pcVar4;
  do {
    pcVar1 = pcVar5;
    pcVar3 = (char *)0x0;
    if (pcVar1 == (char *)0x0) break;
    if (pcVar4 == (char *)0x0) goto LAB_00146f8b;
    pcVar3 = pcVar1;
    pcVar5 = pcVar1 + -1;
  } while ((this + -1)[(long)pcVar1] != (anon_unknown_23)0x2e);
  pcVar5 = pcVar1 + -2;
  while (pcVar1 != (char *)0x1) {
    if (pcVar4 <= pcVar5) {
LAB_00146f8b:
      __assert_fail("index < m_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                    ,0x2ac,"char Catch::StringRef::operator[](size_type) const");
    }
    paVar2 = this + -2 + (long)pcVar1;
    pcVar1 = pcVar1 + -1;
    if ((*paVar2 == (anon_unknown_23)0x5c) || (*paVar2 == (anon_unknown_23)0x2f)) goto LAB_00146f5f;
  }
  pcVar1 = (char *)0x0;
LAB_00146f5f:
  pcVar5 = pcVar4 + -(long)pcVar1;
  if (pcVar3 + (-1 - (long)pcVar1) <= pcVar4 + -(long)pcVar1) {
    pcVar5 = pcVar3 + (-1 - (long)pcVar1);
  }
  pcVar3 = (char *)0x0;
  if (pcVar1 < pcVar4) {
    pcVar3 = pcVar5;
  }
  paVar2 = (anon_unknown_23 *)0x18fc7b;
  if (pcVar1 < pcVar4) {
    paVar2 = this + (long)pcVar1;
  }
  SVar6.m_size = (size_type)pcVar3;
  SVar6.m_start = (char *)paVar2;
  return SVar6;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            --lastDot;

            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }